

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderSupplementalData.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderSupplementalData::SetIFFMission
          (Mode5TransponderSupplementalData *this,KUINT8 IFFM)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  if (IFFM < 8) {
    (this->m_SupplementalDataUnion).m_ui8SupplementalData =
         (this->m_SupplementalDataUnion).m_ui8SupplementalData & 0xe3 | IFFM << 2;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SetIFFMission",&local_39);
  KException::KException(this_00,&local_38,4);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Mode5TransponderSupplementalData::SetIFFMission(KUINT8 IFFM) noexcept(false)
{
	if( IFFM > 7 )throw KException( __FUNCTION__, DATA_TYPE_TOO_LARGE );
	m_SupplementalDataUnion.m_ui8IFFMission = IFFM;
}